

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O3

llb_build_key_t * llb_build_key_make_node(char *path)

{
  CAPIBuildKey *this;
  size_t sVar1;
  StringRef str;
  BuildKey local_38;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  if (path == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(path);
  }
  str.Length = sVar1;
  str.Data = path;
  llbuild::buildsystem::BuildKey::BuildKey(&local_38,'N',str);
  anon_unknown.dwarf_2bd53f::CAPIBuildKey::CAPIBuildKey(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.key.key._M_dataplus._M_p != &local_38.key.key.field_2) {
    operator_delete(local_38.key.key._M_dataplus._M_p,
                    local_38.key.key.field_2._M_allocated_capacity + 1);
  }
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_node(const char *path) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeNode(StringRef(path)));
}